

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.h
# Opt level: O1

void Potassco::print(AbstractProgram *out,Id_t termId,TheoryTerm *term)

{
  Theory_t TVar1;
  uint uVar2;
  char *x;
  iterator pIVar3;
  StringSpan local_38;
  
  TVar1 = TheoryTerm::type(term);
  if (TVar1.val_ == Compound) {
    uVar2 = TheoryTerm::compound(term);
    pIVar3 = TheoryTerm::begin(term);
    local_38.size._0_4_ = TheoryTerm::size(term);
    local_38.first = (char *)pIVar3;
    local_38.size._4_4_ = 0;
    (*out->_vptr_AbstractProgram[0xf])(out,termId,(ulong)uVar2);
  }
  else if (TVar1.val_ == Symbol) {
    x = TheoryTerm::symbol(term);
    local_38 = toSpan(x);
    (*out->_vptr_AbstractProgram[0xe])(out,termId,&local_38);
  }
  else if (TVar1.val_ == Number) {
    uVar2 = TheoryTerm::number(term);
    (*out->_vptr_AbstractProgram[0xd])(out,termId,(ulong)uVar2,out->_vptr_AbstractProgram[0xd]);
    return;
  }
  return;
}

Assistant:

inline void print(AbstractProgram& out, Id_t termId, const TheoryTerm& term) {
	switch (term.type()) {
		case Potassco::Theory_t::Number  : out.theoryTerm(termId, term.number()); break;
		case Potassco::Theory_t::Symbol  : out.theoryTerm(termId, Potassco::toSpan(term.symbol())); break;
		case Potassco::Theory_t::Compound: out.theoryTerm(termId, term.compound(), term.terms()); break;
	}
}